

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::MakeCheckOpValueString<unsigned_char>(ostream *os,uchar *v)

{
  ostream *poVar1;
  uchar *v_local;
  ostream *os_local;
  
  if ((*v < 0x20) || (0x7e < *v)) {
    poVar1 = std::operator<<(os,"unsigned char value ");
    std::ostream::operator<<(poVar1,(ushort)*v);
  }
  else {
    poVar1 = std::operator<<(os,"\'");
    poVar1 = std::operator<<(poVar1,*v);
    std::operator<<(poVar1,"\'");
  }
  return;
}

Assistant:

void MakeCheckOpValueString(std::ostream* os, const unsigned char& v) {
  if (v >= 32 && v <= 126) {
    (*os) << "'" << v << "'";
  } else {
    (*os) << "unsigned char value " << static_cast<unsigned short>(v);
  }
}